

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QPixmapCache::Key>::moveAppend
          (QGenericArrayOps<QPixmapCache::Key> *this,Key *b,Key *e)

{
  Key *pKVar1;
  long lVar2;
  
  if (b != e) {
    pKVar1 = (this->super_QArrayDataPointer<QPixmapCache::Key>).ptr;
    lVar2 = (this->super_QArrayDataPointer<QPixmapCache::Key>).size;
    for (; b < e; b = b + 1) {
      pKVar1[lVar2].d = b->d;
      b->d = (KeyData *)0x0;
      (this->super_QArrayDataPointer<QPixmapCache::Key>).size = lVar2 + 1;
      lVar2 = lVar2 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }